

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

ConcatNDLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_concatnd(NeuralNetworkLayer *this)

{
  bool bVar1;
  Arena *arena;
  ConcatNDLayerParams *pCVar2;
  NeuralNetworkLayer *this_local;
  
  bVar1 = _internal_has_concatnd(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_concatnd(this);
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pCVar2 = google::protobuf::MessageLite::
             CreateMaybeMessage<CoreML::Specification::ConcatNDLayerParams>(arena);
    (this->layer_).concatnd_ = pCVar2;
  }
  return (ConcatNDLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::ConcatNDLayerParams* NeuralNetworkLayer::_internal_mutable_concatnd() {
  if (!_internal_has_concatnd()) {
    clear_layer();
    set_has_concatnd();
    layer_.concatnd_ = CreateMaybeMessage< ::CoreML::Specification::ConcatNDLayerParams >(GetArenaForAllocation());
  }
  return layer_.concatnd_;
}